

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  void *pvVar1;
  rawSeq *prVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  BYTE *pBVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar11;
  BYTE *pBVar12;
  seqDef *psVar13;
  ZSTD_dictMode_e dictMode;
  uint uVar14;
  undefined8 *puVar15;
  ulong uVar16;
  BYTE *litEnd;
  ulong uVar17;
  long lVar18;
  ulong uVar20;
  ulong uVar21;
  BYTE *litLimit_w;
  U32 UVar19;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  uVar10 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (6 < (int)(ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar11;
  }
  pvVar1 = (void *)(srcSize + (long)src);
  uVar20 = rawSeqStore->pos;
  if (0 < (long)srcSize && uVar20 < rawSeqStore->size) {
    puVar5 = (undefined8 *)((long)pvVar1 - 0x20);
    while( true ) {
      prVar2 = rawSeqStore->seq + uVar20;
      uVar21._0_4_ = prVar2->offset;
      uVar21._4_4_ = prVar2->litLength;
      uVar16 = uVar21 >> 0x20;
      uVar9 = rawSeqStore->seq[uVar20].matchLength;
      uVar17 = (ulong)uVar9;
      uVar14 = (uint)((long)pvVar1 - (long)src);
      if (uVar14 < uVar21._4_4_ + uVar9) {
        uVar20 = uVar21;
        if (uVar14 - uVar21._4_4_ < uVar10) {
          uVar20 = 0;
        }
        if (uVar14 < (uint)uVar21._4_4_ || uVar14 - uVar21._4_4_ == 0) {
          uVar20 = 0;
        }
        else {
          uVar17 = (ulong)(uVar14 - uVar21._4_4_);
        }
        ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar1 - (long)src & 0xffffffff,uVar10);
        uVar21 = uVar20;
      }
      else {
        rawSeqStore->pos = uVar20 + 1;
      }
      UVar19 = (U32)uVar21;
      if (UVar19 == 0) break;
      uVar9 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar9) {
        uVar14 = (uVar9 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar14) {
          uVar14 = 0x200;
        }
        ms->nextToUpdate = uVar9 - uVar14;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar16);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      puVar3 = (undefined8 *)(uVar16 + (long)src);
      *rep = UVar19;
      puVar15 = (undefined8 *)((long)puVar3 - sVar11);
      pBVar7 = seqStore->lit;
      if (puVar5 < puVar3) {
        pBVar12 = pBVar7;
        if (puVar15 <= puVar5) {
          lVar18 = (long)puVar5 - (long)puVar15;
          pBVar12 = pBVar7 + lVar18;
          uVar8 = puVar15[1];
          *(undefined8 *)pBVar7 = *puVar15;
          *(undefined8 *)(pBVar7 + 8) = uVar8;
          puVar15 = puVar5;
          if (0x10 < lVar18) {
            lVar18 = 0x10;
            do {
              puVar6 = (undefined8 *)((long)src + lVar18 + (uVar16 - sVar11));
              uVar8 = puVar6[1];
              pBVar4 = pBVar7 + lVar18;
              *(undefined8 *)pBVar4 = *puVar6;
              *(undefined8 *)(pBVar4 + 8) = uVar8;
              puVar6 = (undefined8 *)((long)src + lVar18 + (uVar16 - sVar11) + 0x10);
              uVar8 = puVar6[1];
              *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
              *(undefined8 *)(pBVar4 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar4 + 0x20 < pBVar12);
          }
        }
        if (puVar15 < puVar3) {
          lVar18 = 0;
          do {
            pBVar12[lVar18] = *(BYTE *)((long)puVar15 + lVar18);
            lVar18 = lVar18 + 1;
          } while ((long)puVar3 - (long)puVar15 != lVar18);
        }
LAB_01906b44:
        seqStore->lit = seqStore->lit + sVar11;
        psVar13 = seqStore->sequences;
        if (0xffff < sVar11) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = puVar15[1];
        *(undefined8 *)pBVar7 = *puVar15;
        *(undefined8 *)(pBVar7 + 8) = uVar8;
        pBVar7 = seqStore->lit;
        if (0x10 < sVar11) {
          uVar8 = puVar15[3];
          *(undefined8 *)(pBVar7 + 0x10) = puVar15[2];
          *(undefined8 *)(pBVar7 + 0x18) = uVar8;
          if (0x20 < (long)sVar11) {
            lVar18 = 0;
            do {
              puVar15 = (undefined8 *)((long)src + lVar18 + (uVar16 - sVar11) + 0x20);
              uVar8 = puVar15[1];
              pBVar12 = pBVar7 + lVar18 + 0x20;
              *(undefined8 *)pBVar12 = *puVar15;
              *(undefined8 *)(pBVar12 + 8) = uVar8;
              puVar15 = (undefined8 *)((long)src + lVar18 + (uVar16 - sVar11) + 0x30);
              uVar8 = puVar15[1];
              *(undefined8 *)(pBVar12 + 0x10) = *puVar15;
              *(undefined8 *)(pBVar12 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar12 + 0x20 < pBVar7 + sVar11);
          }
          goto LAB_01906b44;
        }
        seqStore->lit = pBVar7 + sVar11;
        psVar13 = seqStore->sequences;
      }
      psVar13->litLength = (U16)sVar11;
      psVar13->offBase = UVar19 + 3;
      if (0xffff < uVar17 - 3) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar13->mlBase = (U16)(uVar17 - 3);
      seqStore->sequences = psVar13 + 1;
      src = (void *)((long)puVar3 + uVar17);
      uVar20 = rawSeqStore->pos;
      if ((rawSeqStore->size <= uVar20) || (pvVar1 <= src)) break;
    }
  }
  uVar10 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar10) {
    uVar9 = (uVar10 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar9) {
      uVar9 = 0x200;
    }
    ms->nextToUpdate = uVar10 - uVar9;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pvVar1 - (long)src);
  return sVar11;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            int i;
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}